

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O3

LY_ERR lys_compile_node_action(lysc_ctx *ctx,lysp_node *pnode,lysc_node *node)

{
  LY_ERR LVar1;
  LY_ERR LVar2;
  lysp_node *plVar3;
  lysp_node local_f0;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  lysp_node local_90;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_90.next = (lysp_node *)0x0;
  local_90.dsc = (char *)0x0;
  local_48 = 0;
  uStack_40 = 0;
  local_90.exts = (lysp_ext_instance *)0x0;
  uStack_50 = 0;
  local_90.ref = (char *)0x0;
  local_90.iffeatures = (lysp_qname *)0x0;
  local_38 = 0;
  local_90.nodetype = 0x1000;
  local_90.flags = 0;
  local_90._12_4_ = 0;
  local_90.name = "input";
  local_f0.next = (lysp_node *)0x0;
  local_f0.dsc = (char *)0x0;
  local_98 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_f0.exts = (lysp_ext_instance *)0x0;
  uStack_b0 = 0;
  local_f0.ref = (char *)0x0;
  local_f0.iffeatures = (lysp_qname *)0x0;
  local_f0.nodetype = 0x2000;
  local_f0.flags = 0;
  local_f0._12_4_ = 0;
  local_f0.name = "output";
  local_f0.parent = pnode;
  local_90.parent = pnode;
  lysc_update_path(ctx,node->module,"input");
  plVar3 = (lysp_node *)&pnode[1].next;
  if (*(short *)&pnode[1].name == 0) {
    plVar3 = &local_90;
  }
  LVar1 = lys_compile_node_(ctx,plVar3,node,0,lys_compile_node_action_inout,
                            (lysc_node *)&node[1].module,(ly_set *)0x0);
  lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
  if (LVar1 == LY_SUCCESS) {
    LVar2 = lysc_unres_must_add(ctx,(lysc_node *)&node[1].module,plVar3);
    LVar1 = LY_EMEM;
    if (LVar2 == LY_SUCCESS) {
      lysc_update_path(ctx,node->module,"output");
      plVar3 = &local_f0;
      if (*(short *)&pnode[2].exts != 0) {
        plVar3 = (lysp_node *)&pnode[2].iffeatures;
      }
      LVar1 = lys_compile_node_(ctx,plVar3,node,0,lys_compile_node_action_inout,
                                (lysc_node *)&node[2].next,(ly_set *)0x0);
      lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
      if (LVar1 == LY_SUCCESS) {
        LVar1 = lysc_unres_must_add(ctx,(lysc_node *)&node[2].next,plVar3);
      }
    }
  }
  return LVar1;
}

Assistant:

static LY_ERR
lys_compile_node_action(struct lysc_ctx *ctx, struct lysp_node *pnode, struct lysc_node *node)
{
    LY_ERR ret;
    struct lysp_node_action *action_p = (struct lysp_node_action *)pnode;
    struct lysc_node_action *action = (struct lysc_node_action *)node;
    struct lysp_node_action_inout *input, implicit_input = {
        .nodetype = LYS_INPUT,
        .name = "input",
        .parent = pnode,
    };
    struct lysp_node_action_inout *output, implicit_output = {
        .nodetype = LYS_OUTPUT,
        .name = "output",
        .parent = pnode,
    };

    /* input */
    lysc_update_path(ctx, action->module, "input");
    if (action_p->input.nodetype == LYS_UNKNOWN) {
        input = &implicit_input;
    } else {
        input = &action_p->input;
    }
    ret = lys_compile_node_(ctx, &input->node, &action->node, 0, lys_compile_node_action_inout, &action->input.node, NULL);
    lysc_update_path(ctx, NULL, NULL);
    LY_CHECK_GOTO(ret, done);

    /* add must(s) to unres */
    ret = lysc_unres_must_add(ctx, &action->input.node, &input->node);
    LY_CHECK_GOTO(ret, done);

    /* output */
    lysc_update_path(ctx, action->module, "output");
    if (action_p->output.nodetype == LYS_UNKNOWN) {
        output = &implicit_output;
    } else {
        output = &action_p->output;
    }
    ret = lys_compile_node_(ctx, &output->node, &action->node, 0, lys_compile_node_action_inout, &action->output.node, NULL);
    lysc_update_path(ctx, NULL, NULL);
    LY_CHECK_GOTO(ret, done);

    /* add must(s) to unres */
    ret = lysc_unres_must_add(ctx, &action->output.node, &output->node);
    LY_CHECK_GOTO(ret, done);

done:
    return ret;
}